

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::wheelEvent(QGraphicsView *this,QWheelEvent *event)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  QWidget *widget;
  uint uVar7;
  QObject *pQVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QPointF QVar10;
  QPointF local_80;
  QPoint local_70;
  QPointF local_68;
  undefined1 local_58 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  bVar5 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
  if ((bVar5) && ((*(byte *)(lVar1 + 0x300) & 1) != 0)) {
    event[0xc] = (QWheelEvent)0x0;
    local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneWheelEvent::QGraphicsSceneWheelEvent
              ((QGraphicsSceneWheelEvent *)local_58,GraphicsSceneWheel);
    widget = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,widget);
    QVar10 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_80.yp = QVar10.yp;
    local_80.xp = QVar10.xp;
    local_70 = QPointF::toPoint(&local_80);
    QVar10 = mapToScene(this,&local_70);
    local_68.yp = QVar10.yp;
    local_68.xp = QVar10.xp;
    QGraphicsSceneWheelEvent::setScenePos((QGraphicsSceneWheelEvent *)local_58,&local_68);
    QVar10 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    local_68.yp = QVar10.yp;
    local_68.xp = QVar10.xp;
    local_80.xp = (qreal)QPointF::toPoint(&local_68);
    QGraphicsSceneWheelEvent::setScreenPos((QGraphicsSceneWheelEvent *)local_58,(QPoint *)&local_80)
    ;
    QGraphicsSceneWheelEvent::setButtons
              ((QGraphicsSceneWheelEvent *)local_58,
               (QFlagsStorageHelper<Qt::MouseButton,_4>)
               *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
    QGraphicsSceneWheelEvent::setModifiers
              ((QGraphicsSceneWheelEvent *)local_58,
               (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
               *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
    uVar2 = *(ulong *)(event + 0x58);
    uVar6 = (uint)uVar2;
    uVar7 = -uVar6;
    if (0 < (int)uVar6) {
      uVar7 = uVar6;
    }
    uVar9 = (uint)(uVar2 >> 0x20);
    uVar6 = -uVar9;
    if (0 < (int)uVar9) {
      uVar6 = uVar9;
    }
    uVar4 = uVar2 >> 0x20;
    if (uVar6 < uVar7) {
      uVar4 = uVar2;
    }
    QGraphicsSceneWheelEvent::setDelta((QGraphicsSceneWheelEvent *)local_58,(int)uVar4);
    QGraphicsSceneWheelEvent::setPixelDelta
              ((QGraphicsSceneWheelEvent *)local_58,*(QPoint *)(event + 0x50));
    QGraphicsSceneWheelEvent::setPhase
              ((QGraphicsSceneWheelEvent *)local_58,
               *(ushort *)(event + 0x4e) >> 0xc & (ScrollMomentum|ScrollEnd));
    QGraphicsSceneWheelEvent::setInverted
              ((QGraphicsSceneWheelEvent *)local_58,
               SUB21((ushort)*(undefined2 *)(event + 0x4e) >> 0xf,0));
    pQVar8 = (QObject *)0x0;
    QGraphicsSceneWheelEvent::setOrientation
              ((QGraphicsSceneWheelEvent *)local_58,(uVar7 <= uVar6) + Horizontal);
    local_58[0xc] = 0;
    QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
    lVar3 = *(long *)(lVar1 + 0x490);
    if (lVar3 != 0) {
      if (*(int *)(lVar3 + 4) == 0) {
        pQVar8 = (QObject *)0x0;
      }
      else {
        pQVar8 = *(QObject **)(lVar1 + 0x498);
      }
    }
    QCoreApplication::sendEvent(pQVar8,(QEvent *)local_58);
    (**(code **)(*(long *)event + 0x10))(event,local_58[0xc]);
    if (event[0xc] == (QWheelEvent)0x0) {
      QAbstractScrollArea::wheelEvent((QAbstractScrollArea *)this,event);
    }
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QAbstractScrollArea::wheelEvent((QAbstractScrollArea *)this,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::wheelEvent(QWheelEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed) {
        QAbstractScrollArea::wheelEvent(event);
        return;
    }

    event->ignore();

    QGraphicsSceneWheelEvent wheelEvent(QEvent::GraphicsSceneWheel);
    wheelEvent.setWidget(viewport());
    wheelEvent.setScenePos(mapToScene(event->position().toPoint()));
    wheelEvent.setScreenPos(event->globalPosition().toPoint());
    wheelEvent.setButtons(event->buttons());
    wheelEvent.setModifiers(event->modifiers());
    const bool horizontal = qAbs(event->angleDelta().x()) > qAbs(event->angleDelta().y());
    wheelEvent.setDelta(horizontal ? event->angleDelta().x() : event->angleDelta().y());
    wheelEvent.setPixelDelta(event->pixelDelta());
    wheelEvent.setPhase(event->phase());
    wheelEvent.setInverted(event->isInverted());
    wheelEvent.setOrientation(horizontal ? Qt::Horizontal : Qt::Vertical);
    wheelEvent.setAccepted(false);
    wheelEvent.setTimestamp(event->timestamp());
    QCoreApplication::sendEvent(d->scene, &wheelEvent);
    event->setAccepted(wheelEvent.isAccepted());
    if (!event->isAccepted())
        QAbstractScrollArea::wheelEvent(event);
}